

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_fiber_blacken(gravity_vm *vm,gravity_fiber_t *fiber)

{
  uint32_t uVar1;
  gravity_object_t *local_30;
  gravity_upvalue_t *upvalue;
  gravity_value_t *slot;
  uint32_t i;
  gravity_fiber_t *fiber_local;
  gravity_vm *vm_local;
  
  uVar1 = gravity_fiber_size(vm,fiber);
  gravity_vm_memupdate(vm,(ulong)uVar1);
  for (slot._4_4_ = 0; slot._4_4_ < fiber->nframes; slot._4_4_ = slot._4_4_ + 1) {
    gravity_gray_object(vm,(gravity_object_t *)fiber->frames[slot._4_4_].closure);
    gravity_gray_object(vm,(gravity_object_t *)fiber->frames[slot._4_4_].args);
  }
  for (upvalue = (gravity_upvalue_t *)fiber->stack; upvalue < (gravity_upvalue_t *)fiber->stacktop;
      upvalue = (gravity_upvalue_t *)&(upvalue->gc).free) {
    gravity_gray_value(vm,*(gravity_value_t *)upvalue);
  }
  for (local_30 = (gravity_object_t *)fiber->upvalues; local_30 != (gravity_object_t *)0x0;
      local_30 = (gravity_object_t *)local_30->xdata) {
    gravity_gray_object(vm,local_30);
  }
  gravity_gray_object(vm,(gravity_object_t *)fiber->caller);
  return;
}

Assistant:

void gravity_fiber_blacken (gravity_vm *vm, gravity_fiber_t *fiber) {
    gravity_vm_memupdate(vm, gravity_fiber_size(vm, fiber));
    
    // gray call frame functions
    for (uint32_t i=0; i < fiber->nframes; ++i) {
        gravity_gray_object(vm, (gravity_object_t *)fiber->frames[i].closure);
		gravity_gray_object(vm, (gravity_object_t *)fiber->frames[i].args);
    }

    // gray stack variables
    for (gravity_value_t *slot = fiber->stack; slot < fiber->stacktop; ++slot) {
        gravity_gray_value(vm, *slot);
    }

    // gray upvalues
    gravity_upvalue_t *upvalue = fiber->upvalues;
    while (upvalue) {
        gravity_gray_object(vm, (gravity_object_t *)upvalue);
        upvalue = upvalue->next;
    }

    gravity_gray_object(vm, (gravity_object_t *)fiber->caller);
}